

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O2

void __thiscall deci::array_t::~array_t(array_t *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_00108d00;
  ppvVar1 = (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar2 = (this->elements).
                 super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
    (*(*ppvVar2)->_vptr_value_t[3])();
  }
  std::_Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>::~_Vector_base
            (&(this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>
            );
  value_t::~value_t(&this->super_value_t);
  return;
}

Assistant:

array_t::~array_t() {
      for (auto el: this->elements) {
        el->Delete();
      }
    }